

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O1

axbStatus_t axbMemBackendGetByName(axbHandle_s *handle,axbMemBackend_s **mem,char *name)

{
  size_t sVar1;
  axbMemBackend_s **ppaVar2;
  axbMemBackend_s *paVar3;
  int iVar4;
  size_t sVar5;
  
  *mem = (axbMemBackend_s *)0x0;
  sVar1 = handle->memBackends_size;
  if (sVar1 != 0) {
    ppaVar2 = handle->memBackends;
    sVar5 = 0;
    do {
      paVar3 = ppaVar2[sVar5];
      iVar4 = strcmp(paVar3->name,name);
      if (iVar4 == 0) {
        *mem = paVar3;
        return 0;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return 0;
}

Assistant:

axbStatus_t axbMemBackendGetByName(struct axbHandle_s *handle, struct axbMemBackend_s **mem, const char *name)
{
  *mem = NULL;
  for (size_t i=0; i<handle->memBackends_size; ++i){
    if ( strcmp(handle->memBackends[i]->name, name) == 0) {
      *mem = handle->memBackends[i];
      return 0;
    }
  }
  return 0;
}